

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.cxx
# Opt level: O0

bool __thiscall
cmLegacyCommandWrapper::operator()
          (cmLegacyCommandWrapper *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *status)

{
  bool bVar1;
  pointer pcVar2;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> local_28;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> cmd;
  cmExecutionStatus *status_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmLegacyCommandWrapper *this_local;
  
  cmd._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
       (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)status;
  pcVar2 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->(&this->Command);
  (*pcVar2->_vptr_cmCommand[3])();
  pcVar2 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->(&local_28);
  cmCommand::SetExecutionStatus
            (pcVar2,(cmExecutionStatus *)
                    cmd._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
                    super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                    super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl);
  pcVar2 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->(&local_28);
  bVar1 = cmCommand::InvokeInitialPass
                    (pcVar2,args,
                     (cmExecutionStatus *)
                     cmd._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t
                     .super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                     super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl);
  std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::~unique_ptr(&local_28);
  return bVar1;
}

Assistant:

bool cmLegacyCommandWrapper::operator()(
  std::vector<cmListFileArgument> const& args, cmExecutionStatus& status) const
{
  auto cmd = this->Command->Clone();
  cmd->SetExecutionStatus(&status);
  return cmd->InvokeInitialPass(args, status);
}